

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O0

ssize_t __thiscall pbrt::BinaryReader::read(BinaryReader *this,int __fd,void *__buf,size_t __nbytes)

{
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  int32_t size;
  BinaryReader *in_stack_ffffffffffffffa0;
  allocator<char> *__a;
  char in_stack_ffffffffffffffb7;
  size_type in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  BinaryReader *in_stack_ffffffffffffffd0;
  
  read<int,void>(in_stack_ffffffffffffffa0,(int *)this);
  __a = (allocator<char> *)&stack0xffffffffffffffc7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb7,__a);
  std::__cxx11::string::operator=
            ((string *)CONCAT44(in_register_00000034,__fd),(string *)&stack0xffffffffffffffc8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffc7);
  std::__cxx11::string::data();
  copyBytes<char>(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                  (size_t)in_stack_ffffffffffffffc0);
  return extraout_RAX;
}

Assistant:

void read(std::string &t)
    {
      int32_t size;
      read(size);
      t = std::string(size,' ');
      copyBytes(t.data(),size);
    }